

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_attribute __thiscall pugi::xml_node::attribute(xml_node *this,char_t *name_)

{
  bool bVar1;
  char_t *iname;
  xml_attribute_struct *i;
  char_t *name__local;
  xml_node *this_local;
  
  if (this->_root == (xml_node_struct *)0x0) {
    xml_attribute::xml_attribute((xml_attribute *)&this_local);
  }
  else {
    for (iname = (char_t *)this->_root->first_attribute; iname != (char_t *)0x0;
        iname = *(char_t **)(iname + 0x20)) {
      if ((*(char_t **)(iname + 8) != (char_t *)0x0) &&
         (bVar1 = impl::anon_unknown_0::strequal(name_,*(char_t **)(iname + 8)), bVar1)) {
        xml_attribute::xml_attribute((xml_attribute *)&this_local,(xml_attribute_struct *)iname);
        return (xml_attribute)(xml_attribute_struct *)this_local;
      }
    }
    xml_attribute::xml_attribute((xml_attribute *)&this_local);
  }
  return (xml_attribute)(xml_attribute_struct *)this_local;
}

Assistant:

PUGI_IMPL_FN xml_attribute xml_node::attribute(const char_t* name_) const
	{
		if (!_root) return xml_attribute();

		for (xml_attribute_struct* i = _root->first_attribute; i; i = i->next_attribute)
		{
			const char_t* iname = i->name;
			if (iname && impl::strequal(name_, iname))
				return xml_attribute(i);
		}

		return xml_attribute();
	}